

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O0

TiXmlString operator+(char *a,TiXmlString *b)

{
  size_t len;
  size_type sVar1;
  TiXmlString *in_RDX;
  size_type a_len;
  TiXmlString *b_local;
  char *a_local;
  TiXmlString *tmp;
  
  TiXmlString::TiXmlString((TiXmlString *)a);
  len = strlen((char *)b);
  sVar1 = TiXmlString::length(in_RDX);
  TiXmlString::reserve((TiXmlString *)a,len + sVar1);
  TiXmlString::append((TiXmlString *)a,(char *)b,len);
  TiXmlString::operator+=((TiXmlString *)a,in_RDX);
  return (TiXmlString)(Rep *)a;
}

Assistant:

TiXmlString operator + (const char* a, const TiXmlString & b)
{
	TiXmlString tmp;
	TiXmlString::size_type a_len = static_cast<TiXmlString::size_type>( strlen(a) );
	tmp.reserve(a_len + b.length());
	tmp.append(a, a_len);
	tmp += b;
	return tmp;
}